

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O3

void InitNet(void)

{
  size_t sVar1;
  float fVar2;
  longlong lVar3;
  real *prVar4;
  longlong lVar5;
  ushort uVar6;
  long lVar7;
  long lVar8;
  longlong lVar9;
  
  posix_memalign(&syn0,0x80,vocab_size * layer1_size * 4);
  if (syn0 == (real *)0x0) {
LAB_00103506:
    puts("Memory allocation failed");
    exit(1);
  }
  lVar5 = vocab_size;
  if (hs != 0) {
    posix_memalign(&syn1,0x80,vocab_size * layer1_size * 4);
    lVar5 = vocab_size;
    lVar3 = layer1_size;
    if (syn1 == (real *)0x0) goto LAB_00103506;
    if (0 < vocab_size) {
      sVar1 = layer1_size * 4;
      lVar9 = vocab_size;
      prVar4 = syn1;
      do {
        if (0 < lVar3) {
          memset(prVar4,0,sVar1);
        }
        prVar4 = prVar4 + lVar3;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
  }
  if (0 < negative) {
    posix_memalign(&syn1neg,0x80,lVar5 * layer1_size * 4);
    lVar5 = vocab_size;
    lVar3 = layer1_size;
    if (syn1neg == (real *)0x0) goto LAB_00103506;
    if (vocab_size < 1) goto LAB_001034f8;
    sVar1 = layer1_size * 4;
    lVar9 = vocab_size;
    prVar4 = syn1neg;
    do {
      if (0 < lVar3) {
        memset(prVar4,0,sVar1);
      }
      prVar4 = prVar4 + lVar3;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  lVar3 = layer1_size;
  if (0 < lVar5) {
    fVar2 = (float)layer1_size;
    uVar6 = 1;
    lVar7 = 0;
    prVar4 = syn0;
    do {
      if (0 < lVar3) {
        lVar8 = 0;
        do {
          uVar6 = uVar6 * -0x1993 + 0xb;
          prVar4[lVar8] = ((float)uVar6 * 1.5258789e-05 + -0.5) / fVar2;
          lVar8 = lVar8 + 1;
        } while (lVar3 != lVar8);
      }
      lVar7 = lVar7 + 1;
      prVar4 = prVar4 + lVar3;
    } while (lVar7 != lVar5);
  }
LAB_001034f8:
  CreateBinaryTree();
  return;
}

Assistant:

void InitNet() {
  long long a, b;
  unsigned long long next_random = 1;
  a = posix_memalign((void **)&syn0, 128, (long long)vocab_size * layer1_size * sizeof(real));
  if (syn0 == NULL) {printf("Memory allocation failed\n"); exit(1);}
  if (hs) {
    a = posix_memalign((void **)&syn1, 128, (long long)vocab_size * layer1_size * sizeof(real));
    if (syn1 == NULL) {printf("Memory allocation failed\n"); exit(1);}
    for (a = 0; a < vocab_size; a++) for (b = 0; b < layer1_size; b++)
     syn1[a * layer1_size + b] = 0;
  }
  if (negative>0) {
    a = posix_memalign((void **)&syn1neg, 128, (long long)vocab_size * layer1_size * sizeof(real));
    if (syn1neg == NULL) {printf("Memory allocation failed\n"); exit(1);}
    for (a = 0; a < vocab_size; a++) for (b = 0; b < layer1_size; b++)
     syn1neg[a * layer1_size + b] = 0;
  }
  for (a = 0; a < vocab_size; a++) for (b = 0; b < layer1_size; b++) {
    next_random = next_random * (unsigned long long)25214903917 + 11;
    syn0[a * layer1_size + b] = (((next_random & 0xFFFF) / (real)65536) - 0.5) / layer1_size;
  }
  CreateBinaryTree();
}